

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Recycler.cpp
# Opt level: O0

BOOL __thiscall Memory::Recycler::FinishConcurrentCollect(Recycler *this,CollectionFlags flags)

{
  code *pcVar1;
  bool bVar2;
  bool bVar3;
  Phase phase;
  BOOL BVar4;
  CollectionState CVar5;
  DWORD waitTime_00;
  ConfigFlagsTable *pCVar6;
  size_t rescanRootBytes_00;
  undefined8 *in_FS_OFFSET;
  bool local_81;
  DWORD local_80;
  size_t rescanRootBytes;
  DWORD finishMarkWaitTime;
  bool backgroundFinishMark;
  AutoProtectPages protectPages;
  bool needConcurrentSweep;
  BOOL waited;
  DWORD waitTime;
  bool concurrent;
  BOOL forceInThread;
  Phase concurrentPhase;
  CollectionFlags flags_local;
  Recycler *this_local;
  
  BVar4 = IsConcurrentState(this);
  if (BVar4 == 0) {
    AssertCount = AssertCount + 1;
    Js::Throw::LogAssert();
    *(undefined4 *)*in_FS_OFFSET = 1;
    bVar2 = Js::Throw::ReportAssert
                      ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Common/Memory/Recycler.cpp"
                       ,0x16e9,"(false)","false");
    if (!bVar2) {
      pcVar1 = (code *)invalidInstructionException();
      (*pcVar1)();
    }
    *(undefined4 *)*in_FS_OFFSET = 0;
    this_local._4_4_ = 0;
  }
  else {
    bVar2 = false;
    if (((flags & CollectMode_Concurrent) != 0) && (bVar2 = true, (this->priorityBoost & 1U) != 0))
    {
      bVar2 = this->backgroundRescanCount != '\x01';
    }
    (this->collectionParam).priorityBoostConcurrentSweepOverride = (bool)(this->priorityBoost & 1);
    if ((flags & CollectNowForceInThread) == 0) {
      pCVar6 = GetRecyclerFlagsTable(this);
      local_80 = RecyclerHeuristic::FinishConcurrentCollectWaitTime(pCVar6);
    }
    else {
      local_80 = 0xffffffff;
    }
    BVar4 = WaitForConcurrentThread(this,local_80,FinishConcurrentCollect);
    if (BVar4 == 0) {
      this_local._4_4_ = 0;
    }
    else {
      protectPages._15_1_ = 0;
      CVar5 = ObservableValue::operator_cast_to_CollectionState
                        ((ObservableValue *)&this->collectionState);
      if (CVar5 == CollectionStateRescanWait) {
        phase = ConcurrentMarkPhase;
        if ((this->inPartialCollectMode & 1U) != 0) {
          phase = ConcurrentPartialCollectPhase;
        }
        PrintCollectTrace(this,phase,true,false);
        SetCollectionState(this,CollectionStateRescanFindRoots);
        bVar3 = IsPageHeapEnabled(this);
        if ((bVar3) &&
           (pCVar6 = GetRecyclerFlagsTable(this), (pCVar6->RecyclerProtectPagesOnRescan & 1U) != 0))
        {
          AssertCount = AssertCount + 1;
          Js::Throw::LogAssert();
          *(undefined4 *)*in_FS_OFFSET = 1;
          bVar3 = Js::Throw::ReportAssert
                            ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Common/Memory/Recycler.cpp"
                             ,0x1723,
                             "(!(IsPageHeapEnabled() && GetRecyclerFlagsTable().RecyclerProtectPagesOnRescan))"
                             ,"ProtectPagesOnRescan not supported in page heap mode");
          if (!bVar3) {
            pcVar1 = (code *)invalidInstructionException();
            (*pcVar1)();
          }
          *(undefined4 *)*in_FS_OFFSET = 0;
        }
        pCVar6 = GetRecyclerFlagsTable(this);
        AutoProtectPages::AutoProtectPages
                  ((AutoProtectPages *)&finishMarkWaitTime,this,
                   (bool)(pCVar6->RecyclerProtectPagesOnRescan & 1));
        local_81 = false;
        if (((flags & CollectNowForceInThread) == 0) && (local_81 = false, bVar2)) {
          local_81 = (flags & CollectOverride_BackgroundFinishMark) != 0;
        }
        pCVar6 = GetRecyclerFlagsTable(this);
        waitTime_00 = RecyclerHeuristic::BackgroundFinishMarkWaitTime(local_81,pCVar6);
        rescanRootBytes_00 = FinishMark(this,waitTime_00);
        if (rescanRootBytes_00 == 0xffffffffffffffff) {
          BVar4 = IsMarkState(this);
          if (BVar4 == 0) {
            AssertCount = AssertCount + 1;
            Js::Throw::LogAssert();
            *(undefined4 *)*in_FS_OFFSET = 1;
            bVar2 = Js::Throw::ReportAssert
                              ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Common/Memory/Recycler.cpp"
                               ,0x172d,"(this->IsMarkState())","this->IsMarkState()");
            if (!bVar2) {
              pcVar1 = (code *)invalidInstructionException();
              (*pcVar1)();
            }
            *(undefined4 *)*in_FS_OFFSET = 0;
          }
          this_local._4_4_ = 0;
          bVar2 = true;
        }
        else {
          (this->collectionStats).continueCollectAllocBytes = (this->autoHeap).uncollectedAllocBytes
          ;
          pCVar6 = GetRecyclerFlagsTable(this);
          if ((pCVar6->RecyclerVerifyMark & 1U) != 0) {
            VerifyMark(this);
          }
          AutoProtectPages::Unprotect((AutoProtectPages *)&finishMarkWaitTime);
          protectPages._15_1_ = Sweep(this,rescanRootBytes_00,bVar2,true);
          bVar2 = false;
        }
        AutoProtectPages::~AutoProtectPages((AutoProtectPages *)&finishMarkWaitTime);
        if (bVar2) {
          return this_local._4_4_;
        }
      }
      else {
        CVar5 = ObservableValue::operator_cast_to_CollectionState
                          ((ObservableValue *)&this->collectionState);
        if (CVar5 != CollectionStateTransferSweptWait) {
          AssertCount = AssertCount + 1;
          Js::Throw::LogAssert();
          *(undefined4 *)*in_FS_OFFSET = 1;
          bVar2 = Js::Throw::ReportAssert
                            ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Common/Memory/Recycler.cpp"
                             ,0x1776,"(this->collectionState == CollectionStateTransferSweptWait)",
                             "Do we need to handle this state?");
          if (!bVar2) {
            pcVar1 = (code *)invalidInstructionException();
            (*pcVar1)();
          }
          *(undefined4 *)*in_FS_OFFSET = 0;
        }
        FinishTransferSwept(this,flags);
      }
      FinishCollection(this,(bool)(protectPages._15_1_ & 1));
      BVar4 = CollectionInProgress(this);
      if (BVar4 == 0) {
        bVar2 = NeedExhaustiveRepeatCollect(this);
        if (bVar2) {
          DoCollect(this,flags & ~CollectMode_Partial);
        }
        else {
          EndCollection(this);
        }
      }
      this_local._4_4_ = 1;
    }
  }
  return this_local._4_4_;
}

Assistant:

BOOL
Recycler::FinishConcurrentCollect(CollectionFlags flags)
{
    if (!this->IsConcurrentState())
    {
        Assert(false);
        return false;
    }

#ifdef PROFILE_EXEC
    Js::Phase concurrentPhase = Js::ConcurrentCollectPhase;
    // TODO: Remove this workaround for unreferenced local after enabled -profile for GC
    static_cast<Js::Phase>(concurrentPhase);
#endif
#if ENABLE_PARTIAL_GC
    RECYCLER_PROFILE_EXEC_BEGIN2(this, Js::RecyclerPhase,
        (concurrentPhase = ((this->inPartialCollectMode && this->IsConcurrentMarkState())?
            Js::ConcurrentPartialCollectPhase : Js::ConcurrentCollectPhase)));
#else
    RECYCLER_PROFILE_EXEC_BEGIN2(this, Js::RecyclerPhase,
        (concurrentPhase = Js::ConcurrentCollectPhase));
#endif

    // Don't do concurrent sweep if we have priority boosted.
    const BOOL forceInThread = flags & CollectOverride_ForceInThread;
    bool concurrent = (flags & CollectMode_Concurrent) != 0;
    concurrent = concurrent && (!priorityBoost || this->backgroundRescanCount != 1);
#ifdef RECYCLER_TRACE
    collectionParam.priorityBoostConcurrentSweepOverride = priorityBoost;
#endif

    const DWORD waitTime = forceInThread? INFINITE : RecyclerHeuristic::FinishConcurrentCollectWaitTime(this->GetRecyclerFlagsTable());
    GCETW(GC_FINISHCONCURRENTWAIT_START, (this, waitTime));
    const BOOL waited = WaitForConcurrentThread(waitTime, RecyclerWaitReason::FinishConcurrentCollect);
    GCETW(GC_FINISHCONCURRENTWAIT_STOP, (this, !waited));
    if (!waited)
    {
        RECYCLER_PROFILE_EXEC_END2(this, concurrentPhase, Js::RecyclerPhase);
        return false;
    }

    bool needConcurrentSweep = false;
    if (collectionState == CollectionStateRescanWait)
    {
        GCETW_INTERNAL(GC_START, (this, ETWEvent_ConcurrentRescan));
        GCETW_INTERNAL(GC_START2, (this, ETWEvent_ConcurrentRescan, this->collectionStartReason, this->collectionStartFlags));

#ifdef RECYCLER_TRACE
#if ENABLE_PARTIAL_GC
        PrintCollectTrace(this->inPartialCollectMode ? Js::ConcurrentPartialCollectPhase : Js::ConcurrentMarkPhase, true);
#else
        PrintCollectTrace(Js::ConcurrentMarkPhase, true);
#endif
#endif
        SetCollectionState(CollectionStateRescanFindRoots);

#ifdef ENABLE_DEBUG_CONFIG_OPTIONS
        // TODO: Change this behavior
        // ProtectPagesOnRescan is not supported in PageHeap mode because the page protection is changed
        // outside the PageAllocator in PageHeap mode and so pages are not in the state that the
        // PageAllocator expects when it goes to change the page protection
        // One viable fix is to move the guard page protection logic outside of the heap blocks
        // and into the page allocator
        AssertMsg(!(IsPageHeapEnabled() && GetRecyclerFlagsTable().RecyclerProtectPagesOnRescan), "ProtectPagesOnRescan not supported in page heap mode");
        AutoProtectPages protectPages(this, GetRecyclerFlagsTable().RecyclerProtectPagesOnRescan);
#endif

        const bool backgroundFinishMark = !forceInThread && concurrent && ((flags & CollectOverride_BackgroundFinishMark) != 0);
        const DWORD finishMarkWaitTime = RecyclerHeuristic::BackgroundFinishMarkWaitTime(backgroundFinishMark, GetRecyclerFlagsTable());
        size_t rescanRootBytes = FinishMark(finishMarkWaitTime);

        if (rescanRootBytes == Recycler::InvalidScanRootBytes)
        {
            Assert(this->IsMarkState());
            RECYCLER_PROFILE_EXEC_END2(this, concurrentPhase, Js::RecyclerPhase);
            GCETW_INTERNAL(GC_STOP, (this, ETWEvent_ConcurrentRescan));
            GCETW_INTERNAL(GC_STOP2, (this, ETWEvent_ConcurrentRescan, this->collectionStartReason, this->collectionStartFlags));

            // we timeout trying to mark.
            return false;
        }

#ifdef RECYCLER_STATS
        collectionStats.continueCollectAllocBytes = autoHeap.uncollectedAllocBytes;
#endif

#ifdef RECYCLER_VERIFY_MARK
        if (GetRecyclerFlagsTable().RecyclerVerifyMark)
        {
            this->VerifyMark();
        }
#endif

#ifdef ENABLE_DEBUG_CONFIG_OPTIONS
        protectPages.Unprotect();
#endif

#if ENABLE_PARTIAL_GC
        needConcurrentSweep = this->Sweep(rescanRootBytes, concurrent, true);
#else
        needConcurrentSweep = this->Sweep(concurrent);
#endif
        GCETW_INTERNAL(GC_STOP, (this, ETWEvent_ConcurrentRescan));
        GCETW_INTERNAL(GC_STOP2, (this, ETWEvent_ConcurrentRescan, this->collectionStartReason, this->collectionStartFlags));
    }
#if ENABLE_ALLOCATIONS_DURING_CONCURRENT_SWEEP
    else if (collectionState == CollectionStateConcurrentSweepPass1Wait)
    {
        this->FinishSweepPrep();

        if (forceInThread)
        {
            this->FinishConcurrentSweepPass1();
            this->SetCollectionState(CollectionStateConcurrentSweepPass2);
#ifdef RECYCLER_TRACE
            if (this->GetRecyclerFlagsTable().Trace.IsEnabled(Js::ConcurrentSweepPhase) && CONFIG_FLAG_RELEASE(Verbose))
            {
                Output::Print(_u("[GC #%d] Finishing Sweep Pass2 in-thread. \n"), this->collectionCount);
            }
#endif
            this->recyclerSweepManager->FinishSweep();
            this->FinishConcurrentSweep();
            this->recyclerSweepManager->EndBackground();

            uint sweptBytes = 0;
#ifdef RECYCLER_STATS
            sweptBytes = (uint)collectionStats.objectSweptBytes;
#endif

            GCETW(GC_BACKGROUNDSWEEP_STOP, (this, sweptBytes));

            this->SetCollectionState(CollectionStateTransferSweptWait);
            RECYCLER_PROFILE_EXEC_BACKGROUND_END(this, Js::ConcurrentSweepPhase);

            FinishTransferSwept(flags);
        }
        else
        {
            needConcurrentSweep = true;
            // Signal the background thread to finish concurrent sweep Pass2 for all the buckets.
            StartConcurrent(CollectionStateConcurrentSweepPass2);
        }
    }
#endif
    else
    {
        AssertMsg(this->collectionState == CollectionStateTransferSweptWait, "Do we need to handle this state?");
        FinishTransferSwept(flags);
    }